

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.c
# Opt level: O2

uint8_t * plot_single_glyph(tgestate_t *state,int character,uint8_t *output)

{
  tilerow_t tVar1;
  tilerow_t *ptVar2;
  long lVar3;
  
  ptVar2 = bitmap_font["%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%#%%%%%%%%%%%%%$%"[character]].row;
  lVar3 = 0;
  do {
    tVar1 = *ptVar2;
    ptVar2 = ptVar2 + 1;
    output[lVar3] = tVar1;
    lVar3 = lVar3 + 0x100;
  } while ((int)lVar3 != 0x800);
  invalidate_bitmap(state,output,8,8);
  return output + 1;
}

Assistant:

uint8_t *plot_single_glyph(tgestate_t *state, int character, uint8_t *output)
{
  const tile_t    *glyph;        /* was HL */
  const tilerow_t *row;          /* was HL */
  int              iters;        /* was B */
  uint8_t         *saved_output; /* was stacked */

  assert(character < 256);
  assert(output != NULL);

  glyph        = &bitmap_font[ascii_to_font[character]];
  row          = &glyph->row[0];
  saved_output = output;

  iters = 8;
  do
  {
    *output = *row++;
    output += 256; /* Advance to next row. */
  }
  while (--iters);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, saved_output, 8, 8);

  /* Return the position of the next character. */
  return ++saved_output;
}